

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_cache.hpp
# Opt level: O2

shared_ptr<duckdb::ParquetFileMetadataCache,_true> __thiscall
duckdb::ObjectCache::Get<duckdb::ParquetFileMetadataCache>(ObjectCache *this,string *key)

{
  bool bVar1;
  ObjectCacheEntry *pOVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> sVar3;
  shared_ptr<duckdb::ObjectCacheEntry,_true> object;
  undefined1 local_80 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  GetObject((ObjectCache *)local_80,key);
  if ((element_type *)local_80._0_8_ != (element_type *)0x0) {
    pOVar2 = shared_ptr<duckdb::ObjectCacheEntry,_true>::operator->
                       ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)local_80);
    (*pOVar2->_vptr_ObjectCacheEntry[2])(&local_60,pOVar2);
    ParquetFileMetadataCache::ObjectType_abi_cxx11_();
    bVar1 = ::std::operator!=(&local_60,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_60);
    if (!bVar1) {
      ::std::__shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_80 + 0x10),
                 (__shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2> *)local_80);
      shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::ParquetFileMetadataCache>
                ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)this);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
      goto LAB_01db2dd9;
    }
  }
  (this->cache)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->cache)._M_h._M_bucket_count = 0;
LAB_01db2dd9:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  sVar3.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<duckdb::ParquetFileMetadataCache,_true>)
         sVar3.internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T> Get(const string &key) {
		shared_ptr<ObjectCacheEntry> object = GetObject(key);
		if (!object || object->GetObjectType() != T::ObjectType()) {
			return nullptr;
		}
		return shared_ptr_cast<ObjectCacheEntry, T>(object);
	}